

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

bool __thiscall
crnlib::crn_comp::update_progress
          (crn_comp *this,uint phase_index,uint subphase_index,uint subphase_total)

{
  int iVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  undefined1 local_1;
  
  if (*(long *)(*(long *)(in_RDI + 0x2c8) + 0x368) == 0) {
    local_1 = true;
  }
  else {
    iVar1 = (**(code **)(*(long *)(in_RDI + 0x2c8) + 0x368))
                      (in_ESI,0x19,in_EDX,in_ECX,*(undefined8 *)(*(long *)(in_RDI + 0x2c8) + 0x370))
    ;
    local_1 = iVar1 != 0;
  }
  return local_1;
}

Assistant:

bool crn_comp::update_progress(uint phase_index, uint subphase_index, uint subphase_total) {
  if (!m_pParams->m_pProgress_func)
    return true;

#if CRNLIB_ENABLE_DEBUG_MESSAGES
  if (m_pParams->m_flags & cCRNCompFlagDebugging)
    return true;
#endif

  return (*m_pParams->m_pProgress_func)(phase_index, cTotalCompressionPhases, subphase_index, subphase_total, m_pParams->m_pProgress_func_data) != 0;
}